

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakeDirectoryCommand.cxx
# Opt level: O3

bool cmMakeDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *fileName;
  bool bVar1;
  long *plVar2;
  long *plVar3;
  string e;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  fileName = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)fileName == 0x20) {
    bVar1 = cmMakefile::CanIWriteThisFile(status->Makefile,fileName);
    if (bVar1) {
      cmsys::SystemTools::MakeDirectory
                ((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,(mode_t *)0x0);
      return true;
    }
    std::operator+(&local_30,"attempted to create a directory: ",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
    local_50 = &local_40;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_40 = *plVar3;
      lStack_38 = plVar2[3];
    }
    else {
      local_40 = *plVar3;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  else {
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  return false;
}

Assistant:

bool cmMakeDirectoryCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() != 1) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  if (!status.GetMakefile().CanIWriteThisFile(args[0])) {
    std::string e = "attempted to create a directory: " + args[0] +
      " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  cmSystemTools::MakeDirectory(args[0]);
  return true;
}